

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O3

void __thiscall hnsw::HNSWIndex::SaveIndex(HNSWIndex *this,char *filename)

{
  uint32_t *puVar1;
  pointer pVVar2;
  pointer ppVar3;
  HNSWIndex *pHVar4;
  pointer ppVar5;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *__range4
  ;
  pointer pvVar6;
  index_t num_neighbors;
  vector<unsigned_int,_std::allocator<unsigned_int>_> edges;
  pair<unsigned_int,_float> p;
  ofstream os;
  uint local_280;
  undefined4 local_27c;
  void *local_278;
  iterator iStack_270;
  uint *local_268;
  char *local_258;
  uint32_t *local_250;
  HNSWIndex *local_248;
  pointer local_240;
  pair<unsigned_int,_float> local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_258 = filename;
  std::ofstream::ofstream((ofstream *)&local_230,filename,_S_out|_S_bin);
  puVar1 = &this->num_points_;
  std::ostream::write((char *)&local_230,(long)puVar1);
  local_280 = 0;
  if (*puVar1 != 0) {
    local_250 = puVar1;
    local_248 = this;
    do {
      pHVar4 = local_248;
      std::ostream::write((char *)&local_230,(long)&local_280);
      std::ostream::write((char *)&local_230,
                          (long)&(pHVar4->vertices_).
                                 super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_280].layer);
      pVVar2 = (pHVar4->vertices_).
               super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = *(pointer *)
                &pVVar2[local_280].neighbors.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ._M_impl;
      local_240 = *(pointer *)
                   ((long)&pVVar2[local_280].neighbors.
                           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           ._M_impl + 8);
      if (pvVar6 != local_240) {
        do {
          local_278 = (void *)0x0;
          iStack_270._M_current = (uint *)0x0;
          local_268 = (uint *)0x0;
          local_27c = (undefined4)
                      ((ulong)((long)*(pointer *)
                                      ((long)&(pvVar6->
                                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                              )._M_impl.super__Vector_impl_data + 8) -
                              *(long *)&(pvVar6->
                                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                        )._M_impl.super__Vector_impl_data) >> 3);
          ppVar3 = *(pointer *)
                    ((long)&(pvVar6->
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            )._M_impl.super__Vector_impl_data + 8);
          for (ppVar5 = (pvVar6->
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar3;
              ppVar5 = ppVar5 + 1) {
            local_238 = *ppVar5;
            if (iStack_270._M_current == local_268) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278,iStack_270,
                         &local_238.first);
            }
            else {
              *iStack_270._M_current = local_238.first;
              iStack_270._M_current = iStack_270._M_current + 1;
            }
          }
          std::ostream::write((char *)&local_230,(long)&local_27c);
          std::ostream::write((char *)&local_230,(long)local_278);
          if (local_278 != (void *)0x0) {
            operator_delete(local_278);
          }
          pvVar6 = pvVar6 + 1;
        } while (pvVar6 != local_240);
      }
      local_280 = local_280 + 1;
    } while (local_280 < *local_250);
  }
  std::ofstream::close();
  printf("Saved index to %s\n",local_258);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void SaveIndex(const char *filename) {
    std::ofstream os(filename, std::ios::binary | std::ios::out);
    os.write((char *)&num_points_, sizeof(index_t));

    for (index_t i = 0; i < num_points_; i++) {
      os.write((char *)&i, sizeof(index_t));
      os.write((char *)&vertices_[i].layer, sizeof(layer_t));
      for (const auto &neighbors : vertices_[i].neighbors) {
        index_t num_neighbors = neighbors.size();
        std::vector<index_t> edges;
        for (const auto p : neighbors) {
          edges.push_back(p.first);
        }
        os.write((char *)&num_neighbors, sizeof(index_t));
        os.write((char *)edges.data(), sizeof(index_t) * num_neighbors);
      }
    }
    os.close();
    printf("Saved index to %s\n", filename);
  }